

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  uint32_or_64_or_128_t<int> abs_value;
  uint uVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  ulong uVar4;
  error_handler local_21;
  
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>(specs,&local_21);
  if (bVar1) {
    bVar3.container = (buffer<char> *)write_char<char,fmt::v8::appender>(out,value,specs);
  }
  else {
    uVar2 = (uint)value;
    if (value < '\0') {
      uVar2 = -uVar2;
      uVar4 = 0x100002d00000000;
    }
    else {
      uVar4 = (ulong)*(uint *)(&DAT_001dbdc0 + (*(ushort *)&specs->field_0x9 >> 2 & 0x1c)) << 0x20;
    }
    bVar3.container =
         (buffer<char> *)
         write_int_noinline<char,fmt::v8::appender,unsigned_int>
                   (out,(write_int_arg<unsigned_int>)(uVar2 | uVar4),specs,loc);
  }
  return (appender)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}